

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocterm(voccxdef *ctx)

{
  long in_RDI;
  
  voctermfree((vocddef *)0x15e595);
  voctermfree((vocddef *)0x15e5a5);
  voctermfree((vocddef *)0x15e5b5);
  if (*(long *)(in_RDI + 0x11a8) != 0) {
    free(*(void **)(in_RDI + 0x11a8));
  }
  return;
}

Assistant:

void vocterm(voccxdef *ctx)
{
    /* delete the fuses, daemons, and notifiers */
    voctermfree(ctx->voccxfus);
    voctermfree(ctx->voccxdmn);
    voctermfree(ctx->voccxalm);

    /* delete the private stack */
    if (ctx->voc_stk_ptr != 0)
        mchfre(ctx->voc_stk_ptr);
}